

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityType.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::EntityType::EntityType
          (EntityType *this,KUINT8 Kind,KUINT8 Domain,KUINT16 Country,KUINT8 Categoy,
          KUINT8 SubCategory,KUINT8 Specific,KUINT8 Extra)

{
  KUINT8 SubCategory_local;
  KUINT8 Categoy_local;
  KUINT16 Country_local;
  KUINT8 Domain_local;
  KUINT8 Kind_local;
  EntityType *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EntityType_0032d508;
  this->m_ui8EntityKind = Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = Country;
  this->m_ui8Category = Categoy;
  this->m_ui8SubCategory = SubCategory;
  this->m_ui8Specific = Specific;
  this->m_ui8Extra = Extra;
  return;
}

Assistant:

EntityType::EntityType( KUINT8 Kind, KUINT8 Domain, KUINT16 Country, KUINT8 Categoy,
                        KUINT8 SubCategory, KUINT8 Specific, KUINT8 Extra ) :
    m_ui8EntityKind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8SubCategory( SubCategory ),
    m_ui8Specific( Specific ),
    m_ui8Extra( Extra )
{
}